

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O0

void com_alf_init_map(com_seqh_t *seqhdr,u8 *alf_idx_map)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_78;
  int offset_x;
  int j;
  int offset_y;
  int i;
  int regin_h;
  int regin_w;
  int img_height_in_lcu;
  int img_width_in_lcu;
  int lcu_size;
  int tab_region [16];
  u8 *alf_idx_map_local;
  com_seqh_t *seqhdr_local;
  
  tab_region._56_8_ = alf_idx_map;
  memcpy(&img_width_in_lcu,&DAT_0030daa0,0x40);
  iVar1 = seqhdr->max_cuwh;
  iVar2 = seqhdr->pic_width_in_lcu;
  iVar3 = seqhdr->pic_height_in_lcu;
  iVar4 = ((iVar2 + 1) / 4) * iVar1;
  iVar5 = ((iVar3 + 1) / 4) * iVar1;
  seqhdr->alf_idx_map = (uchar *)tab_region._56_8_;
  for (j = 0; j < iVar3; j = j + 1) {
    if (iVar5 == 0) {
      local_84 = 3;
    }
    else {
      if ((j * iVar1) / iVar5 < 4) {
        local_80 = (j * iVar1) / iVar5;
      }
      else {
        local_80 = 3;
      }
      local_84 = local_80;
    }
    for (local_78 = 0; local_78 < iVar2; local_78 = local_78 + 1) {
      if (iVar4 == 0) {
        local_8c = 3;
      }
      else {
        if ((local_78 * iVar1) / iVar4 < 4) {
          local_88 = (local_78 * iVar1) / iVar4;
        }
        else {
          local_88 = 3;
        }
        local_8c = local_88;
      }
      *(char *)(tab_region._56_8_ + (long)local_78) =
           (char)(&img_width_in_lcu)[local_84 * 4 + local_8c];
    }
    tab_region._56_8_ = tab_region._56_8_ + (long)iVar2;
  }
  return;
}

Assistant:

void com_alf_init_map(com_seqh_t *seqhdr, u8 *alf_idx_map)
{
    const int tab_region[NO_VAR_BINS] = { 0, 1, 4, 5, 15, 2, 3, 6, 14, 11, 10, 7, 13, 12,  9,  8 };
    int lcu_size = seqhdr->max_cuwh;
    int img_width_in_lcu  = seqhdr->pic_width_in_lcu;
    int img_height_in_lcu = seqhdr->pic_height_in_lcu;
    int regin_w = ((img_width_in_lcu  + 1) / 4 * lcu_size);
    int regin_h = ((img_height_in_lcu + 1) / 4 * lcu_size);

    seqhdr->alf_idx_map = alf_idx_map;

    for (int i = 0; i < img_height_in_lcu; i++) {
        int offset_y = (regin_h ? COM_MIN(3, (i * lcu_size) / regin_h) : 3) << 2;

        for (int j = 0; j < img_width_in_lcu; j++) {
            int offset_x = (regin_w ? COM_MIN(3, (j * lcu_size) / regin_w) : 3);
            alf_idx_map[j] = tab_region[offset_y + offset_x];
        }
        alf_idx_map += img_width_in_lcu;
    }
}